

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall olc::Renderer_OGL10::SetDecalMode(Renderer_OGL10 *this,DecalMode *mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if (*mode == this->nDecalMode) {
    return;
  }
  switch(*mode) {
  case NORMAL:
  case WIREFRAME:
    uVar2 = 0x302;
    break;
  case ADDITIVE:
    uVar2 = 0x302;
    uVar1 = 1;
    goto LAB_00124073;
  case MULTIPLICATIVE:
    uVar2 = 0x306;
    break;
  case STENCIL:
    uVar2 = 0;
    goto LAB_00124056;
  case ILLUMINATE:
    uVar2 = 0x303;
LAB_00124056:
    uVar1 = 0x302;
    goto LAB_00124073;
  default:
    goto switchD_00124044_default;
  }
  uVar1 = 0x303;
LAB_00124073:
  glBlendFunc(uVar2,uVar1);
switchD_00124044_default:
  this->nDecalMode = *mode;
  return;
}

Assistant:

void SetDecalMode(const olc::DecalMode &mode)
		{
			if (mode != nDecalMode)
			{
				switch (mode)
				{
				case olc::DecalMode::NORMAL:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
					break;
				case olc::DecalMode::ADDITIVE:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE);
					break;
				case olc::DecalMode::MULTIPLICATIVE:
					glBlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA);
					break;
				case olc::DecalMode::STENCIL:
					glBlendFunc(GL_ZERO, GL_SRC_ALPHA);
					break;
				case olc::DecalMode::ILLUMINATE:
					glBlendFunc(GL_ONE_MINUS_SRC_ALPHA, GL_SRC_ALPHA);
					break;
				case olc::DecalMode::WIREFRAME:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
					break;
				}

				nDecalMode = mode;
			}
		}